

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_8::DiskHandle::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,DiskHandle *this)

{
  char *__s;
  long lVar1;
  Entry *pEVar2;
  RemoveConst<kj::ReadableDirectory::Entry> *pRVar3;
  Entry *pEVar4;
  Array<kj::ReadableDirectory::Entry> *pAVar5;
  int iVar6;
  int iVar7;
  Type TVar8;
  uint uVar9;
  __off_t _Var10;
  int *piVar11;
  dirent *pdVar12;
  size_t __n;
  ulong uVar13;
  String *pSVar14;
  size_t sVar15;
  Vector<kj::ReadableDirectory::Entry> entries;
  Fault f_3;
  Fault f_4;
  stat stats;
  Vector<kj::ReadableDirectory::Entry> local_128;
  DIR *local_100;
  Fault local_f8;
  String SStack_f0;
  Fault local_d8;
  Array<kj::ReadableDirectory::Entry> *local_d0;
  undefined1 local_c8 [16];
  size_t sStack_b8;
  mode_t local_b0;
  __uid_t _Stack_ac;
  
  do {
    _Var10 = lseek((this->fd).fd,0,0);
    if (-1 < _Var10) {
      iVar6 = 0;
      break;
    }
    iVar6 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  if (iVar6 != 0) {
    local_128.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_128,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_128);
  }
  do {
    iVar6 = dup((this->fd).fd);
    if (-1 < iVar6) {
      iVar7 = 0;
      break;
    }
    iVar7 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar7 == -1);
  if (iVar7 != 0) {
    local_128.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_128,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_128);
  }
  local_d0 = __return_storage_ptr__;
  local_100 = fdopendir(iVar6);
  if (local_100 == (DIR *)0x0) {
    close(iVar6);
    __errno_location();
    local_128.builder.ptr = (Entry *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_128,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_128);
  }
  local_128.builder.ptr = (Entry *)0x0;
  local_128.builder.pos = (Entry *)0x0;
  local_128.builder.endPtr = (Entry *)0x0;
  piVar11 = __errno_location();
  do {
    *piVar11 = 0;
    pdVar12 = readdir(local_100);
    if (pdVar12 == (dirent *)0x0) {
      if (*piVar11 != 0) {
        local_f8.exception = (Exception *)0x0;
        local_c8._0_8_ = 0;
        local_c8._8_8_ = 0;
        kj::_::Debug::Fault::init
                  (&local_f8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_f8);
      }
    }
    else {
      __s = pdVar12->d_name;
      __n = strlen(__s);
      uVar13 = __n + 1;
      if (__n == 2) {
LAB_004c14eb:
        iVar6 = bcmp(__s,"..",__n);
        if (iVar6 == 0) goto LAB_004c168a;
      }
      else if (__n == 1) {
        iVar6 = bcmp(__s,".",1);
        if (iVar6 == 0) goto LAB_004c168a;
        if (uVar13 == 3) goto LAB_004c14eb;
      }
      if ((uVar13 < 9) || (*(long *)__s != 0x2e706d742d6a6b2e)) {
        if (pdVar12->d_type == '\0') {
          do {
            iVar6 = fstatat((this->fd).fd,__s,(stat *)local_c8,0x100);
            if (-1 < iVar6) {
              iVar6 = 0;
              break;
            }
            uVar9 = kj::_::Debug::getOsErrorNumber(false);
            uVar13 = uVar13 & 0xffffffff;
            if (uVar9 != 0xffffffff) {
              uVar13 = (ulong)uVar9;
            }
            iVar6 = (int)uVar13;
          } while (uVar9 == 0xffffffff);
          if (iVar6 != 0) {
            local_d8.exception = (Exception *)0x0;
            local_f8.exception = (Exception *)0x0;
            SStack_f0.content.ptr = (char *)0x0;
            kj::_::Debug::Fault::init
                      (&local_d8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                      );
            kj::_::Debug::Fault::fatal(&local_d8);
          }
          TVar8 = modeToType(local_b0);
          local_f8.exception._0_4_ = TVar8;
          heapString(&SStack_f0,__s,__n);
          if (local_128.builder.pos == local_128.builder.endPtr) {
            sVar15 = (long)local_128.builder.endPtr - (long)local_128.builder.ptr >> 4;
            if (local_128.builder.endPtr == local_128.builder.ptr) {
              sVar15 = 4;
            }
            Vector<kj::ReadableDirectory::Entry>::setCapacity(&local_128,sVar15);
          }
          (local_128.builder.pos)->type = (Type)local_f8.exception;
          ((local_128.builder.pos)->name).content.ptr = SStack_f0.content.ptr;
          ((local_128.builder.pos)->name).content.size_ = SStack_f0.content.size_;
          ((local_128.builder.pos)->name).content.disposer = SStack_f0.content.disposer;
          pSVar14 = &SStack_f0;
        }
        else {
          TVar8 = modeToType((uint)pdVar12->d_type << 0xc);
          local_c8._0_4_ = TVar8;
          heapString((String *)(local_c8 + 8),__s,__n);
          if (local_128.builder.pos == local_128.builder.endPtr) {
            sVar15 = (long)local_128.builder.endPtr - (long)local_128.builder.ptr >> 4;
            if (local_128.builder.endPtr == local_128.builder.ptr) {
              sVar15 = 4;
            }
            Vector<kj::ReadableDirectory::Entry>::setCapacity(&local_128,sVar15);
          }
          (local_128.builder.pos)->type = local_c8._0_4_;
          ((local_128.builder.pos)->name).content.ptr = (char *)local_c8._8_8_;
          ((local_128.builder.pos)->name).content.size_ = sStack_b8;
          ((local_128.builder.pos)->name).content.disposer =
               (ArrayDisposer *)CONCAT44(_Stack_ac,local_b0);
          pSVar14 = (String *)(local_c8 + 8);
        }
        (pSVar14->content).ptr = (char *)0x0;
        (pSVar14->content).size_ = 0;
        local_128.builder.pos = local_128.builder.pos + 1;
      }
    }
LAB_004c168a:
    if (pdVar12 == (dirent *)0x0) {
      if (local_128.builder.pos != local_128.builder.endPtr) {
        Vector<kj::ReadableDirectory::Entry>::setCapacity
                  (&local_128,(long)local_128.builder.pos - (long)local_128.builder.ptr >> 5);
      }
      pAVar5 = local_d0;
      pRVar3 = local_128.builder.pos;
      pEVar2 = local_128.builder.ptr;
      uVar13 = (long)local_128.builder.pos - (long)local_128.builder.ptr >> 5;
      local_d0->ptr = local_128.builder.ptr;
      local_d0->size_ = uVar13;
      local_d0->disposer = local_128.builder.disposer;
      local_128.builder.ptr = (Entry *)0x0;
      local_128.builder.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
      local_128.builder.endPtr = (Entry *)0x0;
      if (pRVar3 != pEVar2) {
        lVar1 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::__introsort_loop<kj::ReadableDirectory::Entry*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pEVar2,pRVar3,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<kj::ReadableDirectory::Entry*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pEVar2,pRVar3);
      }
      pEVar4 = local_128.builder.endPtr;
      pRVar3 = local_128.builder.pos;
      pEVar2 = local_128.builder.ptr;
      if (local_128.builder.ptr != (Entry *)0x0) {
        local_128.builder.ptr = (Entry *)0x0;
        local_128.builder.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
        local_128.builder.endPtr = (Entry *)0x0;
        (**(local_128.builder.disposer)->_vptr_ArrayDisposer)
                  (local_128.builder.disposer,pEVar2,0x20,(long)pRVar3 - (long)pEVar2 >> 5,
                   (long)pEVar4 - (long)pEVar2 >> 5,
                   ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry,_false>::destruct);
      }
      closedir(local_100);
      return pAVar5;
    }
  } while( true );
}

Assistant:

Array<ReadableDirectory::Entry> listEntries() const {
    return list(true, [](StringPtr name, FsNode::Type type) {
      return ReadableDirectory::Entry { type, heapString(name), };
    });
  }